

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void free_parser(vw *all)

{
  substring *psVar1;
  unsigned_long *puVar2;
  io_buf *piVar3;
  char *pcVar4;
  parser *ppVar5;
  
  ppVar5 = all->p;
  psVar1 = (ppVar5->words)._begin;
  if (psVar1 != (substring *)0x0) {
    free(psVar1);
  }
  (ppVar5->words)._begin = (substring *)0x0;
  (ppVar5->words)._end = (substring *)0x0;
  (ppVar5->words).end_array = (substring *)0x0;
  ppVar5 = all->p;
  psVar1 = (ppVar5->name)._begin;
  if (psVar1 != (substring *)0x0) {
    free(psVar1);
  }
  (ppVar5->name)._begin = (substring *)0x0;
  (ppVar5->name)._end = (substring *)0x0;
  (ppVar5->name).end_array = (substring *)0x0;
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar5 = all->p;
    puVar2 = (ppVar5->gram_mask)._begin;
    if (puVar2 != (unsigned_long *)0x0) {
      free(puVar2);
    }
    (ppVar5->gram_mask)._begin = (unsigned_long *)0x0;
    (ppVar5->gram_mask)._end = (unsigned_long *)0x0;
    (ppVar5->gram_mask).end_array = (unsigned_long *)0x0;
  }
  ppVar5 = all->p;
  piVar3 = ppVar5->output;
  if (piVar3 != (io_buf *)0x0) {
    pcVar4 = (piVar3->finalname)._begin;
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    (piVar3->finalname)._begin = (char *)0x0;
    (piVar3->finalname)._end = (char *)0x0;
    (piVar3->finalname).end_array = (char *)0x0;
    pcVar4 = (piVar3->currentname)._begin;
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    (piVar3->currentname)._begin = (char *)0x0;
    (piVar3->currentname)._end = (char *)0x0;
    (piVar3->currentname).end_array = (char *)0x0;
    ppVar5 = all->p;
  }
  puVar2 = (ppVar5->counts)._begin;
  if (puVar2 != (unsigned_long *)0x0) {
    free(puVar2);
  }
  (ppVar5->counts)._begin = (unsigned_long *)0x0;
  (ppVar5->counts)._end = (unsigned_long *)0x0;
  (ppVar5->counts).end_array = (unsigned_long *)0x0;
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  all.p->counts.delete_v();
}